

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * ImageFromImage(Image *__return_storage_ptr__,Image image,Rectangle rec)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  void *__src;
  int iVar6;
  float local_68;
  float fStack_64;
  float local_48;
  float fStack_44;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  iVar1 = GetPixelDataSize(1,1,image.format);
  local_68 = rec.width;
  fStack_64 = rec.height;
  __return_storage_ptr__->width = (int)local_68;
  uVar4 = (uint)fStack_64;
  __return_storage_ptr__->height = uVar4;
  iVar2 = (int)local_68 * iVar1;
  pvVar3 = calloc((long)(int)(iVar2 * uVar4),1);
  __return_storage_ptr__->data = pvVar3;
  __return_storage_ptr__->format = image.format;
  __return_storage_ptr__->mipmaps = 1;
  if (0 < (int)uVar4) {
    local_48 = rec.x;
    fStack_44 = rec.y;
    uVar5 = (ulong)uVar4;
    __src = (void *)(((long)(int)fStack_44 * (long)image.width + (long)(int)local_48) * (long)iVar1
                    + (long)image.data);
    iVar6 = 0;
    do {
      memcpy((void *)((long)pvVar3 + (long)iVar6),__src,(long)iVar2);
      __src = (void *)((long)__src + (long)iVar1 * (long)image.width);
      iVar6 = iVar6 + iVar2;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromImage(Image image, Rectangle rec)
{
    Image result = { 0 };

    int bytesPerPixel = GetPixelDataSize(1, 1, image.format);

    result.width = (int)rec.width;
    result.height = (int)rec.height;
    result.data = RL_CALLOC((int)rec.width*(int)rec.height*bytesPerPixel, 1);
    result.format = image.format;
    result.mipmaps = 1;

    for (int y = 0; y < (int)rec.height; y++)
    {
        memcpy(((unsigned char *)result.data) + y*(int)rec.width*bytesPerPixel, ((unsigned char *)image.data) + ((y + (int)rec.y)*image.width + (int)rec.x)*bytesPerPixel, (int)rec.width*bytesPerPixel);
    }

    return result;
}